

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_glaciate(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  undefined2 uVar1;
  short sVar2;
  short sVar3;
  void *in_RDX;
  int in_ESI;
  ROOM_AFFECT_DATA raf;
  ROOM_INDEX_DATA *room;
  void *in_stack_ffffffffffffff88;
  ushort in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9a;
  undefined2 uVar4;
  undefined2 in_stack_ffffffffffffff9c;
  short sVar5;
  undefined2 in_stack_ffffffffffffff9e;
  undefined2 in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa2;
  undefined2 uVar6;
  undefined2 in_stack_ffffffffffffffa4;
  undefined2 in_stack_ffffffffffffffa6;
  
  if (*(short *)(*(long *)((long)in_RDX + 0xa8) + 0x150) == 6) {
    if (*(short *)(*(long *)(*(long *)((long)in_RDX + 0xa8) + 0x30) + 0x15c) == 0) {
      send_to_char((char *)CONCAT26(in_stack_ffffffffffffffa6,
                                    CONCAT24(in_stack_ffffffffffffffa4,
                                             CONCAT22(in_stack_ffffffffffffffa2,
                                                      in_stack_ffffffffffffffa0))),
                   (CHAR_DATA *)
                   CONCAT26(in_stack_ffffffffffffff9e,
                            CONCAT24(in_stack_ffffffffffffff9c,
                                     CONCAT22(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98)))
                  );
    }
    else {
      init_affect_room((ROOM_AFFECT_DATA *)0x6e5e36);
      uVar4 = 0;
      uVar1 = (undefined2)in_ESI;
      sVar2 = (short)(in_ESI / 7) + 3;
      uVar6 = 3;
      sVar3 = 0x12 - *(short *)(*(long *)((long)in_RDX + 0xa8) + 0x150);
      sVar5 = gsn_glaciate;
      new_affect_to_room((ROOM_INDEX_DATA *)
                         CONCAT26(in_stack_ffffffffffffffa6,CONCAT24(sVar3,CONCAT22(3,sVar2))),
                         (ROOM_AFFECT_DATA *)
                         CONCAT26(uVar1,CONCAT24(gsn_glaciate,(uint)in_stack_ffffffffffffff98)));
      act((char *)CONCAT26(in_stack_ffffffffffffffa6,CONCAT24(sVar3,CONCAT22(uVar6,sVar2))),
          (CHAR_DATA *)CONCAT26(uVar1,CONCAT24(sVar5,CONCAT22(uVar4,in_stack_ffffffffffffff98))),
          in_RDX,in_stack_ffffffffffffff88,0);
    }
  }
  else {
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffffa6,
                                  CONCAT24(in_stack_ffffffffffffffa4,
                                           CONCAT22(in_stack_ffffffffffffffa2,
                                                    in_stack_ffffffffffffffa0))),
                 (CHAR_DATA *)
                 CONCAT26(in_stack_ffffffffffffff9e,
                          CONCAT24(in_stack_ffffffffffffff9c,
                                   CONCAT22(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98))));
  }
  return;
}

Assistant:

void spell_glaciate(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	ROOM_INDEX_DATA *room = ch->in_room;
	ROOM_AFFECT_DATA raf;

	if (room->sector_type != SECT_WATER)
	{
		send_to_char("You must be on the surface of water to cast this spell.\n\r", ch);
		return;
	}

	if (room->area->temp == Temperature::Hot)
	{
		send_to_char("The ambient temperature is too high to freeze the water.\n\r", ch);
		return;
	}

	init_affect_room(&raf);
	raf.where = TO_ROOM_AFFECTS;
	raf.type = gsn_glaciate;
	raf.aftype = AFT_SPELL;
	raf.level = level;
	raf.duration = 3 + level / 7;
	raf.location = APPLY_ROOM_SECT;
	raf.modifier = SECT_ICE - ch->in_room->sector_type;
	raf.owner = ch;
	raf.end_fun = glaciate_melt;
	raf.tick_fun = nullptr;
	new_affect_to_room(room, &raf);

	act("The water beneath you suddenly congeals into glacial ice.", ch, 0, 0, TO_CHAR);
}